

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample_by_2_internal.c
# Opt level: O3

void WebRtcSpl_UpBy2IntToInt(int32_t *in,int32_t len,int32_t *out,int32_t *state)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  
  if (0 < len) {
    lVar3 = 0;
    do {
      iVar4 = *(int *)((long)in + lVar3 * 2);
      iVar1 = state[5];
      iVar2 = ((iVar4 - iVar1) + 0x2000 >> 0xe) * 0x335 + state[4];
      state[4] = iVar4;
      state[5] = iVar2;
      iVar2 = iVar2 - state[6];
      iVar1 = ((iVar2 >> 0xe) - (iVar2 >> 0x1f)) * 0x17de + iVar1;
      iVar4 = iVar1 - state[7];
      iVar4 = ((iVar4 >> 0xe) - (iVar4 >> 0x1f)) * 0x305e + state[6];
      state[7] = iVar4;
      state[6] = iVar1;
      out[(int)lVar3] = iVar4;
      lVar3 = lVar3 + 2;
    } while ((ulong)(uint)len * 2 != lVar3);
    if (0 < len) {
      lVar3 = 0;
      do {
        iVar4 = *(int *)((long)in + lVar3 * 2);
        iVar1 = state[1];
        iVar2 = ((iVar4 - iVar1) + 0x2000 >> 0xe) * 0xbea + *state;
        *state = iVar4;
        state[1] = iVar2;
        iVar2 = iVar2 - state[2];
        iVar1 = ((iVar2 >> 0xe) - (iVar2 >> 0x1f)) * 0x2498 + iVar1;
        iVar4 = iVar1 - state[3];
        iVar4 = ((iVar4 >> 0xe) - (iVar4 >> 0x1f)) * 0x3ad7 + state[2];
        state[3] = iVar4;
        state[2] = iVar1;
        out[(long)(int)lVar3 + 1] = iVar4;
        lVar3 = lVar3 + 2;
      } while ((ulong)(uint)len * 2 != lVar3);
    }
  }
  return;
}

Assistant:

void WebRtcSpl_UpBy2IntToInt(const int32_t *in, int32_t len, int32_t *out,
                             int32_t *state)
{
    int32_t tmp0, tmp1, diff;
    int32_t i;

    // upper allpass filter (generates odd output samples)
    for (i = 0; i < len; i++)
    {
        tmp0 = in[i];
        diff = tmp0 - state[5];
        // scale down and round
        diff = (diff + (1 << 13)) >> 14;
        tmp1 = state[4] + diff * kResampleAllpass[0][0];
        state[4] = tmp0;
        diff = tmp1 - state[6];
        // scale down and truncate
        diff = diff >> 14;
        if (diff < 0)
            diff += 1;
        tmp0 = state[5] + diff * kResampleAllpass[0][1];
        state[5] = tmp1;
        diff = tmp0 - state[7];
        // scale down and truncate
        diff = diff >> 14;
        if (diff < 0)
            diff += 1;
        state[7] = state[6] + diff * kResampleAllpass[0][2];
        state[6] = tmp0;

        // scale down, round and store
        out[i << 1] = state[7];
    }

    out++;

    // lower allpass filter (generates even output samples)
    for (i = 0; i < len; i++)
    {
        tmp0 = in[i];
        diff = tmp0 - state[1];
        // scale down and round
        diff = (diff + (1 << 13)) >> 14;
        tmp1 = state[0] + diff * kResampleAllpass[1][0];
        state[0] = tmp0;
        diff = tmp1 - state[2];
        // scale down and truncate
        diff = diff >> 14;
        if (diff < 0)
            diff += 1;
        tmp0 = state[1] + diff * kResampleAllpass[1][1];
        state[1] = tmp1;
        diff = tmp0 - state[3];
        // scale down and truncate
        diff = diff >> 14;
        if (diff < 0)
            diff += 1;
        state[3] = state[2] + diff * kResampleAllpass[1][2];
        state[2] = tmp0;

        // scale down, round and store
        out[i << 1] = state[3];
    }
}